

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sender.cc
# Opt level: O0

void receive_result(sender *s)

{
  ulong uVar1;
  long *plVar2;
  vw *all;
  long in_RDI;
  float fVar3;
  label_data *ld;
  example *ec;
  float weight;
  float res;
  void *pvVar4;
  float *in_stack_ffffffffffffffe0;
  float *in_stack_ffffffffffffffe8;
  long lVar5;
  int in_stack_fffffffffffffff4;
  
  get_prediction(in_stack_fffffffffffffff4,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  pvVar4 = *(void **)(in_RDI + 0x18);
  uVar1 = *(ulong *)(in_RDI + 0x28);
  *(ulong *)(in_RDI + 0x28) = uVar1 + 1;
  lVar5 = *(long *)((long)pvVar4 +
                   (uVar1 % *(ulong *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x220)) * 8);
  *(int *)(lVar5 + 0x6850) = in_stack_fffffffffffffff4;
  all = (vw *)(lVar5 + 0x6828);
  plVar2 = *(long **)(*(long *)(in_RDI + 0x10) + 0x3548);
  fVar3 = (float)(**(code **)(*plVar2 + 8))
                           (*(undefined4 *)(lVar5 + 0x6850),*(undefined4 *)&all->sd,plVar2,
                            **(undefined8 **)(in_RDI + 0x10));
  *(float *)(lVar5 + 0x68b0) = fVar3 * *(float *)(lVar5 + 0x6870);
  return_simple_example(all,pvVar4,(example *)0x2aedc0);
  return;
}

Assistant:

void receive_result(sender& s)
{
  float res, weight;

  get_prediction(s.sd, res, weight);
  example& ec = *s.delay_ring[s.received_index++ % s.all->p->ring_size];
  ec.pred.scalar = res;

  label_data& ld = ec.l.simple;
  ec.loss = s.all->loss->getLoss(s.all->sd, ec.pred.scalar, ld.label) * ec.weight;

  return_simple_example(*(s.all), nullptr, ec);
}